

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

sexp_conflict
sexp_load_standard_repl_env
          (sexp_conflict ctx,sexp_conflict env,sexp_conflict k,int bootp,int nonblocking)

{
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  sexp_conflict in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict e;
  sexp_gc_var_t local_38;
  sexp_conflict local_28;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = (sexp_conflict)0x43e;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_38,0,0x10);
  local_38.var = &local_28;
  local_38.next = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = &local_38;
  local_28 = (sexp_conflict)sexp_load_standard_env(in_RDI,local_10,local_18);
  if ((((ulong)local_28 & 3) != 0) || (local_28->tag != 0x13)) {
    if (local_1c == 0) {
      local_28 = (sexp_conflict)
                 sexp_eval_string(in_RDI,"(mutable-environment \'(scheme small))",0xffffffffffffffff
                                  ,(((in_RDI->value).type.setters)->value).opcode.func);
    }
    if ((((ulong)local_28 & 3) != 0) || (local_28->tag != 0x13)) {
      sexp_add_import_binding
                ((sexp_conflict)
                 CONCAT44(__sexp_gc_preserver1.var._4_4_,__sexp_gc_preserver1.var._0_4_),in_RDI);
    }
    if ((((ulong)local_28 & 3) != 0) || (local_28->tag != 0x13)) {
      local_28 = sexp_load_standard_params
                           (e,(sexp_conflict)__sexp_gc_preserver1.next,
                            __sexp_gc_preserver1.var._4_4_);
    }
  }
  (in_RDI->value).context.saves = local_38.next;
  return local_28;
}

Assistant:

static sexp sexp_load_standard_repl_env (sexp ctx, sexp env, sexp k, int bootp, int nonblocking) {
  sexp_gc_var1(e);
  sexp_gc_preserve1(ctx, e);
  e = sexp_load_standard_env(ctx, env, k);
  if (!sexp_exceptionp(e)) {
#if SEXP_USE_MODULES
    if (!bootp)
      e = sexp_eval_string(ctx, sexp_default_environment, -1, sexp_global(ctx, SEXP_G_META_ENV));
    if (!sexp_exceptionp(e))
      sexp_add_import_binding(ctx, e);
#endif
    if (!sexp_exceptionp(e))
      e = sexp_load_standard_params(ctx, e, nonblocking);
  }
  sexp_gc_release1(ctx);
  return e;
}